

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall
duckdb::UpdateSegment::Update
          (UpdateSegment *this,TransactionData transaction,idx_t column_index,Vector *update_p,
          row_t *ids,idx_t count,Vector *base_data)

{
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *this_00;
  uint *__last;
  data_ptr_t pdVar1;
  long lVar2;
  initialize_update_function_t p_Var3;
  merge_update_function_t p_Var4;
  long lVar5;
  bool bVar6;
  shared_ptr<duckdb::BlockHandle,_true> *psVar7;
  UndoBufferReference *pUVar8;
  transaction_t tVar9;
  optional_ptr<duckdb::UndoBufferEntry,_true> __first;
  int iVar10;
  idx_t i_1;
  idx_t count_00;
  pointer pUVar11;
  reference pvVar12;
  TransactionException *this_01;
  data_ptr_t pdVar13;
  uint uVar14;
  ulong uVar15;
  idx_t iVar16;
  ulong uVar17;
  idx_t iVar18;
  uint *__i;
  shared_ptr<duckdb::BlockHandle,_true> *__last_00;
  idx_t iVar19;
  ulong uVar20;
  UpdateInfo *pUVar21;
  UpdateInfo *pUVar22;
  bool bVar23;
  UndoBufferPointer UVar24;
  UndoBufferReference pin;
  SelectionVector sel;
  UndoBufferReference node_ref;
  UndoBufferReference root_pin;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> write_lock;
  value_type root_pointer;
  UnifiedVectorFormat update_format;
  UpdateInfo *local_190;
  undefined1 local_180 [32];
  ulong local_160;
  UndoBufferReference local_158;
  UpdateInfo *local_130;
  SelectionVector local_128;
  idx_t local_110;
  UndoBufferReference local_108;
  UndoBufferReference local_e0;
  Vector *local_b8;
  undefined1 local_b0 [16];
  idx_t iStack_a0;
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *local_98;
  idx_t local_90;
  UndoBufferPointer local_88;
  UnifiedVectorFormat local_78;
  
  local_110 = column_index;
  StorageLock::GetExclusiveLock((StorageLock *)local_b0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(update_p,count,&local_78);
  local_128.sel_vector = (sel_t *)0x0;
  local_128.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_128.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->stats_lock);
  if (iVar10 != 0) {
    ::std::__throw_system_error(iVar10);
  }
  count_00 = (*this->statistics_update_function)(this,&this->stats,&local_78,count,&local_128);
  pthread_mutex_unlock((pthread_mutex_t *)&this->stats_lock);
  if (count_00 != 0) {
    local_e0.entry.ptr = (UndoBufferEntry *)ids;
    local_b8 = base_data;
    if (count_00 != 1) {
      uVar15 = 0;
      do {
        uVar20 = uVar15;
        if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
          uVar20 = (ulong)*(uint *)((long)(BufferManager **)local_128.sel_vector + uVar15 * 4);
        }
        uVar17 = uVar15 + 1;
        if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
          uVar17 = (ulong)*(uint *)((long)(BufferManager **)local_128.sel_vector + uVar15 * 4 + 4);
        }
        bVar6 = false;
      } while ((ids[uVar20] < ids[uVar17]) &&
              (bVar23 = count_00 - 2 != uVar15, uVar15 = uVar15 + 1, bVar6 = true, bVar23));
      if (!bVar6) {
        SelectionVector::SelectionVector((SelectionVector *)&local_158,count_00);
        __first.ptr = local_158.entry.ptr;
        iVar16 = 0;
        do {
          uVar14 = (uint)iVar16;
          if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
            uVar14 = *(uint *)((long)(BufferManager **)local_128.sel_vector + iVar16 * 4);
          }
          *(uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar16 * 4) = uVar14;
          iVar16 = iVar16 + 1;
        } while (count_00 != iVar16);
        __last = (uint *)((long)&(local_158.entry.ptr)->buffer_manager + count_00 * 4);
        lVar5 = 0x3f;
        if (count_00 != 0) {
          for (; count_00 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        ::std::
        __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                  ((uint *)local_158.entry.ptr,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                    )&local_e0);
        if ((long)count_00 < 0x11) {
          ::std::
          __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                    ((uint *)__first.ptr,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                      )&local_e0);
        }
        else {
          __last_00 = &__first.ptr[1].block;
          ::std::
          __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                    ((uint *)__first.ptr,(uint *)__last_00,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                      )&local_e0);
          do {
            uVar15 = (ulong)*(uint *)((long)(__last_00 + -1) + 0xc);
            uVar14 = *(uint *)&(__last_00->internal).
                               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
            lVar5 = ids[uVar14];
            lVar2 = ids[uVar15];
            psVar7 = __last_00;
            while (lVar5 < lVar2) {
              *(uint *)&(psVar7->internal).
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (uint)uVar15;
              uVar15 = (ulong)*(uint *)((long)(psVar7 + -1) + 8);
              psVar7 = (shared_ptr<duckdb::BlockHandle,_true> *)((long)(psVar7 + -1) + 0xc);
              lVar2 = ids[uVar15];
            }
            *(uint *)&(psVar7->internal).
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 uVar14;
            __last_00 = (shared_ptr<duckdb::BlockHandle,_true> *)
                        ((long)&(__last_00->internal).
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 4);
          } while (__last_00 != (shared_ptr<duckdb::BlockHandle,_true> *)__last);
        }
        iVar16 = 1;
        iVar19 = 1;
        do {
          if (local_158.entry.ptr == (UndoBufferEntry *)0x0) {
            uVar15 = iVar16 - 1;
            iVar18 = iVar16;
          }
          else {
            uVar15 = (ulong)*(uint *)((long)local_158.entry.ptr + iVar16 * 4 + -4);
            iVar18 = (idx_t)*(uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar16 * 4);
          }
          if (ids[uVar15] != ids[iVar18]) {
            *(uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar19 * 4) = (uint)iVar18;
            iVar19 = iVar19 + 1;
          }
          iVar16 = iVar16 + 1;
        } while (count_00 != iVar16);
        shared_ptr<duckdb::SelectionData,_true>::operator=
                  (&local_128.selection_data,
                   (shared_ptr<duckdb::SelectionData,_true> *)&local_158.handle);
        local_128.sel_vector = (sel_t *)local_158.entry.ptr;
        count_00 = iVar19;
        if (local_158.handle.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.handle.handle.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
      }
    }
    if ((UndoBufferEntry *)local_128.sel_vector == (UndoBufferEntry *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)*(uint *)(BufferManager **)local_128.sel_vector;
    }
    iVar16 = this->column_data->start;
    uVar15 = ids[uVar15] - iVar16;
    uVar20 = uVar15 >> 0xb;
    InitializeUpdateInfo(this,uVar20);
    this_00 = &this->root;
    pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
              operator->(this_00);
    pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,uVar20);
    iVar16 = (uVar15 & 0xfffffffffffff800) + iVar16;
    local_160 = uVar20;
    if (pvVar12->entry == (UndoBufferEntry *)0x0) {
      iVar19 = this->type_size;
      local_98 = this_00;
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(this_00);
      UndoBufferAllocator::Allocate
                (&local_158,&pUVar11->allocator,iVar19 * 0x800 + 0x204f & 0xfffffffffffff848);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
      pdVar1 = (local_158.handle.node.ptr)->buffer;
      local_130 = (UpdateInfo *)(pdVar1 + local_158.position);
      pdVar13 = pdVar1 + 0x24 + local_158.position;
      pdVar13[0] = '\0';
      pdVar13[1] = '\b';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      LOCK();
      pdVar13 = pdVar1 + 0x10 + local_158.position;
      pdVar13[0] = '_';
      pdVar13[1] = '\0';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      pdVar13[4] = '\0';
      pdVar13[5] = '\0';
      pdVar13[6] = '\0';
      pdVar13[7] = '@';
      UNLOCK();
      pdVar13 = pdVar1 + local_158.position;
      pdVar13[0] = '\0';
      pdVar13[1] = '\0';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      pdVar13[4] = '\0';
      pdVar13[5] = '\0';
      pdVar13[6] = '\0';
      pdVar13[7] = '\0';
      pdVar13 = pdVar1 + 0x28 + local_158.position;
      pdVar13[0] = '\0';
      pdVar13[1] = '\0';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      pdVar13[4] = '\0';
      pdVar13[5] = '\0';
      pdVar13[6] = '\0';
      pdVar13[7] = '\0';
      pdVar13 = pdVar1 + 0x38 + local_158.position;
      pdVar13[0] = '\0';
      pdVar13[1] = '\0';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      pdVar13[4] = '\0';
      pdVar13[5] = '\0';
      pdVar13[6] = '\0';
      pdVar13[7] = '\0';
      local_90 = local_158.position;
      *(idx_t *)(pdVar1 + 8 + local_158.position) = local_110;
      InitializeUpdateInfo(this,local_130,ids,&local_128,count_00,local_160,iVar16);
      local_e0.entry.ptr = (UndoBufferEntry *)0x0;
      BufferHandle::BufferHandle(&local_e0.handle);
      tVar9 = transaction.transaction_id;
      local_e0.position = 0;
      local_180._0_8_ = (UpdateInfo *)0x0;
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        local_180._0_8_ = operator_new__(this->type_size * 0x800 + 0x204f & 0xfffffffffffff848);
        ((UpdateInfo *)local_180._0_8_)->max = 0x800;
        LOCK();
        (((UpdateInfo *)local_180._0_8_)->version_number).super___atomic_base<unsigned_long>._M_i =
             tVar9;
        UNLOCK();
        ((UpdateInfo *)local_180._0_8_)->segment = (UpdateSegment *)0x0;
        (((UpdateInfo *)local_180._0_8_)->prev).entry = (UndoBufferEntry *)0x0;
        (((UpdateInfo *)local_180._0_8_)->next).entry = (UndoBufferEntry *)0x0;
        local_190 = (UpdateInfo *)local_180._0_8_;
      }
      else {
        optional_ptr<duckdb::DuckTransaction,_true>::CheckValid(&transaction.transaction);
        DuckTransaction::CreateUpdateInfo
                  (&local_108,transaction.transaction.ptr,this->type_size,count_00);
        local_e0.entry.ptr = local_108.entry.ptr;
        BufferHandle::operator=(&local_e0.handle,&local_108.handle);
        local_e0.position = local_108.position;
        BufferHandle::~BufferHandle(&local_108.handle);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_e0.handle.node);
        local_180._0_8_ = (local_e0.handle.node.ptr)->buffer + local_e0.position;
        local_190 = (UpdateInfo *)0x0;
      }
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      InitializeUpdateInfo
                (this,(UpdateInfo *)local_180._0_8_,ids,&local_128,count_00,local_160,iVar16);
      p_Var3 = this->initialize_update_function;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      (*p_Var3)((UpdateInfo *)local_180._0_8_,local_b8,local_130,&local_78,&local_128);
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        UVar24 = (UndoBufferPointer)ZEXT816(0);
      }
      else {
        UVar24 = UndoBufferReference::GetBufferPointer(&local_e0);
      }
      pdVar13 = pdVar1 + local_90 + 0x28;
      local_130->next = UVar24;
      pdVar13[0] = '\0';
      pdVar13[1] = '\0';
      pdVar13[2] = '\0';
      pdVar13[3] = '\0';
      pdVar13[4] = '\0';
      pdVar13[5] = '\0';
      pdVar13[6] = '\0';
      pdVar13[7] = '\0';
      pdVar1 = pdVar1 + local_90 + 0x30;
      pdVar1[0] = '\0';
      pdVar1[1] = '\0';
      pdVar1[2] = '\0';
      pdVar1[3] = '\0';
      pdVar1[4] = '\0';
      pdVar1[5] = '\0';
      pdVar1[6] = '\0';
      pdVar1[7] = '\0';
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      ((UndoBufferPointer *)(local_180._0_8_ + 0x38))->entry = (UndoBufferEntry *)0x0;
      *(idx_t *)(local_180._0_8_ + 0x40) = 0;
      UVar24 = UndoBufferReference::GetBufferPointer(&local_158);
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      *(UndoBufferPointer *)(local_180._0_8_ + 0x28) = UVar24;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      *(idx_t *)(local_180._0_8_ + 8) = local_110;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      UVar24 = UndoBufferReference::GetBufferPointer(&local_158);
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(local_98);
      pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,local_160);
      pvVar12->entry = UVar24.entry;
      pvVar12->position = UVar24.position;
      BufferHandle::~BufferHandle(&local_e0.handle);
      if (local_190 != (UpdateInfo *)0x0) {
        operator_delete__(local_190);
      }
      pUVar8 = &local_158;
    }
    else {
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(this_00);
      pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,uVar20);
      local_88.entry = pvVar12->entry;
      local_88.position = pvVar12->position;
      UndoBufferPointer::Pin(&local_e0,&local_88);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_e0.handle.node);
      pUVar21 = (UpdateInfo *)((local_e0.handle.node.ptr)->buffer + local_e0.position);
      local_108.entry.ptr = (UndoBufferEntry *)0x0;
      BufferHandle::BufferHandle(&local_108.handle);
      tVar9 = transaction.transaction_id;
      local_108.position = 0;
      local_b0._8_8_ = (pUVar21->next).entry;
      iStack_a0 = (pUVar21->next).position;
      local_130 = (UpdateInfo *)transaction.start_time;
      if ((UndoBufferEntry *)local_b0._8_8_ != (UndoBufferEntry *)0x0) {
        do {
          UndoBufferPointer::Pin(&local_158,(UndoBufferPointer *)(local_b0 + 8));
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
          pdVar13 = (local_158.handle.node.ptr)->buffer + local_158.position;
          if (*(transaction_t *)((local_158.handle.node.ptr)->buffer + 0x10 + local_158.position) ==
              tVar9) {
            local_108.entry.ptr = local_158.entry.ptr;
            BufferHandle::operator=(&local_108.handle,&local_158.handle);
            local_108.position = local_158.position;
          }
          else if (local_130 < *(UpdateInfo **)(pdVar13 + 0x10)) {
            uVar15 = 0;
            uVar20 = 0;
            do {
              uVar17 = uVar15;
              if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
                uVar17 = (ulong)*(uint *)((long)(BufferManager **)local_128.sel_vector + uVar15 * 4)
                ;
              }
              if (ids[uVar17] - iVar16 == (ulong)*(uint *)(pdVar13 + uVar20 * 4 + 0x48)) {
                this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
                local_180._0_8_ = local_180 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_180,"Conflict on update!","");
                TransactionException::TransactionException(this_01,(string *)local_180);
                __cxa_throw(this_01,&TransactionException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              if ((long)(ids[uVar17] - iVar16) < (long)(ulong)*(uint *)(pdVar13 + uVar20 * 4 + 0x48)
                 ) {
                uVar15 = uVar15 + 1;
                if (uVar15 != count_00) goto LAB_010f4c0f;
LAB_010f4c00:
                bVar6 = false;
              }
              else {
                uVar20 = uVar20 + 1;
                if (uVar20 == *(uint *)(pdVar13 + 0x20)) goto LAB_010f4c00;
LAB_010f4c0f:
                bVar6 = true;
              }
            } while (bVar6);
          }
          local_b0._8_8_ = *(undefined8 *)(pdVar13 + 0x38);
          iStack_a0 = *(idx_t *)(pdVar13 + 0x40);
          BufferHandle::~BufferHandle(&local_158.handle);
        } while ((UndoBufferEntry *)local_b0._8_8_ != (UndoBufferEntry *)0x0);
      }
      tVar9 = transaction.transaction_id;
      local_180._0_8_ = (UpdateInfo *)0x0;
      if (local_108.entry.ptr == (UndoBufferEntry *)0x0) {
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          local_180._0_8_ = operator_new__(this->type_size * 0x800 + 0x204f & 0xfffffffffffff848);
          ((UpdateInfo *)local_180._0_8_)->max = 0x800;
          LOCK();
          (((UpdateInfo *)local_180._0_8_)->version_number).super___atomic_base<unsigned_long>._M_i
               = tVar9;
          UNLOCK();
          ((UpdateInfo *)local_180._0_8_)->segment = (UpdateSegment *)0x0;
          (((UpdateInfo *)local_180._0_8_)->prev).entry = (UndoBufferEntry *)0x0;
          (((UpdateInfo *)local_180._0_8_)->next).entry = (UndoBufferEntry *)0x0;
          uVar15 = local_160;
          pUVar22 = (UpdateInfo *)local_180._0_8_;
        }
        else {
          optional_ptr<duckdb::DuckTransaction,_true>::CheckValid(&transaction.transaction);
          uVar15 = local_160;
          DuckTransaction::CreateUpdateInfo
                    (&local_158,transaction.transaction.ptr,this->type_size,count_00);
          local_108.entry.ptr = local_158.entry.ptr;
          BufferHandle::operator=(&local_108.handle,&local_158.handle);
          local_108.position = local_158.position;
          BufferHandle::~BufferHandle(&local_158.handle);
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_108.handle.node);
          local_180._0_8_ = (local_108.handle.node.ptr)->buffer + local_108.position;
          pUVar22 = (UpdateInfo *)0x0;
        }
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        *(UpdateSegment **)local_180._0_8_ = this;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        *(ulong *)(local_180._0_8_ + 0x18) = uVar15;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        *(sel_t *)(local_180._0_8_ + 0x20) = 0;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        *(idx_t *)(local_180._0_8_ + 8) = local_110;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        iVar16 = (pUVar21->next).position;
        ((UndoBufferPointer *)(local_180._0_8_ + 0x38))->entry = (pUVar21->next).entry;
        *(idx_t *)(local_180._0_8_ + 0x40) = iVar16;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        if (((UndoBufferPointer *)(local_180._0_8_ + 0x38))->entry != (UndoBufferEntry *)0x0) {
          optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
          UndoBufferPointer::Pin(&local_158,(UndoBufferPointer *)(local_180._0_8_ + 0x38));
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
          pdVar13 = (local_158.handle.node.ptr)->buffer;
          UVar24 = UndoBufferReference::GetBufferPointer(&local_108);
          *(UndoBufferEntry **)(pdVar13 + 0x28 + local_158.position) = UVar24.entry;
          *(idx_t *)(pdVar13 + 0x30 + local_158.position) = UVar24.position;
          BufferHandle::~BufferHandle(&local_158.handle);
        }
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
        ((UndoBufferPointer *)(local_180._0_8_ + 0x28))->entry = local_88.entry;
        *(idx_t *)(local_180._0_8_ + 0x30) = local_88.position;
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          UVar24 = (UndoBufferPointer)ZEXT816(0);
        }
        else {
          UVar24 = UndoBufferReference::GetBufferPointer(&local_108);
        }
        pUVar21->next = UVar24;
      }
      else {
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_108.handle.node);
        local_180._0_8_ = (local_108.handle.node.ptr)->buffer + local_108.position;
        pUVar22 = (UpdateInfo *)0x0;
      }
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      p_Var4 = this->merge_update_function;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      (*p_Var4)(pUVar21,local_b8,(UpdateInfo *)local_180._0_8_,&local_78,ids,count_00,&local_128);
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)local_180);
      if (pUVar22 != (UpdateInfo *)0x0) {
        operator_delete__(pUVar22);
      }
      BufferHandle::~BufferHandle(&local_108.handle);
      pUVar8 = &local_e0;
    }
    BufferHandle::~BufferHandle(&pUVar8->handle);
  }
  if (local_128.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((element_type *)local_b0._0_8_ != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_b0._0_8_);
    operator_delete((void *)local_b0._0_8_);
  }
  return;
}

Assistant:

void UpdateSegment::Update(TransactionData transaction, idx_t column_index, Vector &update_p, row_t *ids, idx_t count,
                           Vector &base_data) {
	// obtain an exclusive lock
	auto write_lock = lock.GetExclusiveLock();

	UnifiedVectorFormat update_format;
	update_p.ToUnifiedFormat(count, update_format);

	// update statistics
	SelectionVector sel;
	{
		lock_guard<mutex> stats_guard(stats_lock);
		count = statistics_update_function(this, stats, update_format, count, sel);
	}
	if (count == 0) {
		return;
	}

	// subsequent algorithms used by the update require row ids to be (1) sorted, and (2) unique
	// this is usually the case for "standard" queries (e.g. UPDATE tbl SET x=bla WHERE cond)
	// however, for more exotic queries involving e.g. cross products/joins this might not be the case
	// hence we explicitly check here if the ids are sorted and, if not, sort + duplicate eliminate them
	count = SortSelectionVector(sel, count, ids);
	D_ASSERT(count > 0);

	// get the vector index based on the first id
	// we assert that all updates must be part of the same vector
	auto first_id = ids[sel.get_index(0)];
	idx_t vector_index = (UnsafeNumericCast<idx_t>(first_id) - column_data.start) / STANDARD_VECTOR_SIZE;
	idx_t vector_offset = column_data.start + vector_index * STANDARD_VECTOR_SIZE;
	InitializeUpdateInfo(vector_index);

	D_ASSERT(idx_t(first_id) >= column_data.start);

	if (root->info[vector_index].IsSet()) {
		// there is already a version here, check if there are any conflicts and search for the node that belongs to
		// this transaction in the version chain
		auto root_pointer = root->info[vector_index];
		auto root_pin = root_pointer.Pin();
		auto &base_info = UpdateInfo::Get(root_pin);

		UndoBufferReference node_ref;
		CheckForConflicts(base_info.next, transaction, ids, sel, count, UnsafeNumericCast<row_t>(vector_offset),
		                  node_ref);

		// there are no conflicts - continue with the update
		unsafe_unique_array<char> update_info_data;
		optional_ptr<UpdateInfo> node;
		if (!node_ref.IsSet()) {
			// no updates made yet by this transaction: initially the update info to empty
			if (transaction.transaction) {
				auto &dtransaction = transaction.transaction->Cast<DuckTransaction>();
				node_ref = dtransaction.CreateUpdateInfo(type_size, count);
				node = &UpdateInfo::Get(node_ref);
			} else {
				node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
			}
			node->segment = this;
			node->vector_index = vector_index;
			node->N = 0;
			node->column_index = column_index;

			// insert the new node into the chain
			node->next = base_info.next;
			if (node->next.IsSet()) {
				auto next_pin = node->next.Pin();
				auto &next_info = UpdateInfo::Get(next_pin);
				next_info.prev = node_ref.GetBufferPointer();
			}
			node->prev = root_pointer;
			base_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		} else {
			// we already had updates made to this transaction
			node = &UpdateInfo::Get(node_ref);
		}
		base_info.Verify();
		node->Verify();

		// now we are going to perform the merge
		merge_update_function(base_info, base_data, *node, update_format, ids, count, sel);

		base_info.Verify();
		node->Verify();
	} else {
		// there is no version info yet: create the top level update info and fill it with the updates
		// allocate space for the UpdateInfo in the allocator
		idx_t alloc_size = UpdateInfo::GetAllocSize(type_size);
		auto handle = root->allocator.Allocate(alloc_size);
		auto &update_info = UpdateInfo::Get(handle);
		UpdateInfo::Initialize(update_info, TRANSACTION_ID_START - 1);
		update_info.column_index = column_index;

		InitializeUpdateInfo(update_info, ids, sel, count, vector_index, vector_offset);

		// now create the transaction level update info in the undo log
		unsafe_unique_array<char> update_info_data;
		UndoBufferReference node_ref;
		optional_ptr<UpdateInfo> transaction_node;
		if (transaction.transaction) {
			node_ref = transaction.transaction->CreateUpdateInfo(type_size, count);
			transaction_node = &UpdateInfo::Get(node_ref);
		} else {
			transaction_node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
		}

		InitializeUpdateInfo(*transaction_node, ids, sel, count, vector_index, vector_offset);

		// we write the updates in the update node data, and write the updates in the info
		initialize_update_function(*transaction_node, base_data, update_info, update_format, sel);

		update_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		update_info.prev = UndoBufferPointer();
		transaction_node->next = UndoBufferPointer();
		transaction_node->prev = handle.GetBufferPointer();
		transaction_node->column_index = column_index;

		transaction_node->Verify();
		update_info.Verify();

		root->info[vector_index] = handle.GetBufferPointer();
	}
}